

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmqBrokerServer.cpp
# Opt level: O2

void __thiscall helics::apps::zmqBrokerServer::stopServer(zmqBrokerServer *this)

{
  string_view message;
  string_view message_00;
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  sockaddr *__addr;
  int in_R8D;
  undefined1 auStack_88 [12];
  int port;
  string local_78;
  value_type V;
  socket_t reqSocket;
  shared_ptr<ZmqContextManager> ctx;
  
  LOCK();
  (this->exitAll)._M_base._M_i = true;
  UNLOCK();
  if ((this->zmq_enabled_ == false) && (this->zmqss_enabled_ != true)) {
    return;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  ZmqContextManager::getContextPointer((ZmqContextManager *)&ctx,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  zmq::socket_t::socket_t
            (&reqSocket,
             ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             zcontext)._M_t.
             super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
             super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
             super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl,
             (this->zmq_enabled_ ^ 1) * 2 + 3);
  local_78._M_dataplus._M_p._0_4_ = 300;
  zmq::detail::socket_base::setsockopt<int>(&reqSocket.super_socket_base,0x11,(int *)&local_78);
  port = this->mZmqPort;
  if (port == 0) {
    if (this->zmq_enabled_ == true) {
      iVar2 = getDefaultPort(1);
      port = iVar2 + 1;
    }
    else {
      port = getDefaultPort(10);
    }
  }
  if (this->zmq_enabled_ == true) {
    bVar1 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[4],_0>(this->config_,(char (*) [4])"zmq");
    if (!bVar1) goto LAB_001950e8;
    pvVar3 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)this->config_,"zmq");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json(&V,pvVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"interface",(allocator<char> *)(auStack_88 + 0xb));
    fileops::replaceIfMember(&V,(string *)&local_78,&this->mZmqInterface);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"port",(allocator<char> *)(auStack_88 + 0xb));
    fileops::replaceIfMember(&V,(string *)&local_78,&port);
  }
  else {
    bVar1 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[6],_0>(this->config_,(char (*) [6])0x3710a7);
    if (!bVar1) goto LAB_001950e8;
    pvVar3 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)this->config_,"zmqss");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json(&V,pvVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"interface",(allocator<char> *)(auStack_88 + 0xb));
    fileops::replaceIfMember(&V,(string *)&local_78,&this->mZmqInterface);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"port",(allocator<char> *)(auStack_88 + 0xb));
    fileops::replaceIfMember(&V,(string *)&local_78,&port);
  }
  std::__cxx11::string::~string((string *)&local_78);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&V.m_data);
LAB_001950e8:
  gmlc::networking::makePortAddress(&local_78,(string *)&this->mZmqInterface,port);
  zmq::detail::socket_base::connect
            (&reqSocket.super_socket_base,(int)local_78._M_dataplus._M_p,__addr,in_ECX);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&V,"close_server:",(allocator<char> *)(auStack_88 + 0xb));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&V,
                 &this->name_);
  iVar2 = (int)&local_78;
  zmq::detail::socket_base::send
            (&reqSocket.super_socket_base,iVar2,(void *)0x0,CONCAT44(in_register_0000000c,in_ECX),
             in_R8D);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&V);
  zmq::socket_t::close(&reqSocket,iVar2);
  CLI::std::mutex::lock(&this->threadGuard);
  if (this->zmq_enabled_ == true) {
    iVar2 = 0x371a02;
    message._M_str._4_4_ = port;
    message._0_12_ = auStack_88;
    TypedBrokerServer::logMessage(message);
  }
  if (this->zmqss_enabled_ == true) {
    iVar2 = 0x371a1d;
    message_00._M_str._4_4_ = port;
    message_00._0_12_ = auStack_88;
    TypedBrokerServer::logMessage(message_00);
  }
  std::thread::join();
  pthread_mutex_unlock((pthread_mutex_t *)&this->threadGuard);
  zmq::socket_t::close(&reqSocket,iVar2);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void zmqBrokerServer::stopServer()
{
    exitAll.store(true);
#ifdef HELICS_ENABLE_ZMQ_CORE
    if (!zmq_enabled_ && !zmqss_enabled_) {
        return;
    }
    auto ctx = ZmqContextManager::getContextPointer();
    zmq::socket_t reqSocket(ctx->getBaseContext(), (zmq_enabled_) ? ZMQ_REQ : ZMQ_DEALER);
    reqSocket.setsockopt(ZMQ_LINGER, 300);
    int port = (mZmqPort != 0) ? mZmqPort :
                                 ((zmq_enabled_) ? getDefaultPort(HELICS_CORE_TYPE_ZMQ) + 1 :
                                                   getDefaultPort(HELICS_CORE_TYPE_ZMQ_SS));
    if (zmq_enabled_) {
        if (config_->contains("zmq")) {
            auto V = (*config_)["zmq"];
            fileops::replaceIfMember(V, "interface", mZmqInterface);
            fileops::replaceIfMember(V, "port", port);
        }
    } else {
        if (config_->contains("zmqss")) {
            auto V = (*config_)["zmqss"];
            fileops::replaceIfMember(V, "interface", mZmqInterface);
            fileops::replaceIfMember(V, "port", port);
        }
    }

    try {
        reqSocket.connect(gmlc::networking::makePortAddress(mZmqInterface, port));
        reqSocket.send(std::string("close_server:") + name_);
        reqSocket.close();
    }
    catch (const zmq::error_t&) {
    }

    std::lock_guard<std::mutex> tlock(threadGuard);
    if (zmq_enabled_) {
        logMessage("stopping zmq broker server");
    }
    if (zmqss_enabled_) {
        logMessage("stopping zmq ss broker server");
    }
    mainLoopThread.join();
#endif
}